

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPack.c
# Opt level: O0

void Aig_ManPackPrintCare(Aig_ManPack_t *p)

{
  int iVar1;
  int local_24;
  int i;
  word Sign;
  Aig_Obj_t *pObj;
  Aig_ManPack_t *p_local;
  
  for (local_24 = 0; iVar1 = Vec_PtrSize(p->pAig->vCis), local_24 < iVar1; local_24 = local_24 + 1)
  {
    Vec_PtrEntry(p->pAig->vCis,local_24);
    Vec_WrdEntry(p->vPiCare,local_24);
  }
  return;
}

Assistant:

void Aig_ManPackPrintCare( Aig_ManPack_t * p )
{
    Aig_Obj_t * pObj;
    word Sign;
    int i;
    Aig_ManForEachCi( p->pAig, pObj, i )
    {
        Sign = Vec_WrdEntry( p->vPiCare, i );
//        Extra_PrintBinary( stdout, (unsigned *)&Sign, 64 );
//        printf( "\n" );
    }
//    printf( "\n" );
}